

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Path::resolve(Path *this,Value *root,Value *defaultValue)

{
  bool bVar1;
  reference pPVar2;
  Value *in_RDX;
  Value *in_RDI;
  Value *in_stack_00000008;
  undefined4 in_stack_00000010;
  ArrayIndex in_stack_00000014;
  PathArgument *arg;
  const_iterator it;
  Value *node;
  Value *this_00;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_30;
  Value *local_28;
  
  this_00 = in_RDI;
  local_28 = in_RDX;
  local_30._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin
                 ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
  do {
    std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end
              ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)this_00,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_RDI);
    if (!bVar1) {
      Value::Value((Value *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008);
      return this_00;
    }
    pPVar2 = __gnu_cxx::
             __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
             ::operator*(&local_30);
    if (pPVar2->kind_ == kindIndex) {
      bVar1 = Value::isArray(local_28);
      if ((!bVar1) ||
         (bVar1 = Value::isValidIndex(this_00,(ArrayIndex)((ulong)in_RDI >> 0x20)), !bVar1)) {
        Value::Value((Value *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008);
        return this_00;
      }
      local_28 = Value::operator[]((Value *)arg,in_stack_00000014);
    }
    else if (pPVar2->kind_ == kindKey) {
      bVar1 = Value::isObject(local_28);
      if (!bVar1) {
        Value::Value((Value *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008);
        return this_00;
      }
      local_28 = Value::operator[](this_00,(string *)in_RDI);
      if (local_28 == (Value *)kNull) {
        Value::Value((Value *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008);
        return this_00;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::null)
        return defaultValue;
    }
  }
  return *node;
}